

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodecTests.cc
# Opt level: O2

void avro::parsing::testReaderFail<avro::parsing::ValidatingCodecFactory>(TestData2 *td)

{
  basic_wrap_stringstream<char> *pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  OutputStream *this;
  shared_count *this_00;
  auto_ptr<avro::OutputStream> p;
  auto_ptr<avro::InputStream> in;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v;
  assertion_result local_290;
  ValidSchema vs;
  const_string local_268 [4];
  const_string local_228;
  const_string local_218;
  const_string local_208;
  const_string local_1f8;
  const_string local_1e8;
  const_string local_1d8;
  undefined1 local_1c8 [8];
  shared_count local_1c0;
  undefined8 *local_1b8;
  char *local_1b0;
  
  testReaderFail<avro::parsing::ValidatingCodecFactory>::testNo =
       testReaderFail<avro::parsing::ValidatingCodecFactory>::testNo + 1;
  local_268[0].m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
  ;
  local_268[0].m_end = "";
  memset((basic_wrap_stringstream<char> *)local_1c8,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream
            ((basic_wrap_stringstream<char> *)local_1c8);
  std::operator<<((ostream *)local_1c8,"Test: ");
  pbVar1 = boost::operator<<((basic_wrap_stringstream<char> *)local_1c8,
                             &testReaderFail<avro::parsing::ValidatingCodecFactory>::testNo);
  std::operator<<((ostream *)pbVar1,' ');
  std::operator<<((ostream *)pbVar1," schema: ");
  pbVar1 = boost::operator<<(pbVar1,&td->schema);
  std::operator<<((ostream *)pbVar1," correctCalls: ");
  pbVar1 = boost::operator<<(pbVar1,&td->correctCalls);
  std::operator<<((ostream *)pbVar1," incorrectCalls: ");
  pbVar1 = boost::operator<<(pbVar1,&td->incorrectCalls);
  std::operator<<((ostream *)pbVar1," skip-level: ");
  pbVar1 = boost::operator<<(pbVar1,&td->depth);
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar1);
  local_1d8.m_begin = (pbVar2->_M_dataplus)._M_p;
  local_1d8.m_end = local_1d8.m_begin + pbVar2->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pbVar1,local_268,0x2d7,&local_1d8);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream
            ((basic_wrap_stringstream<char> *)local_1c8);
  makeValidSchema((parsing *)&vs,td->schema);
  v.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  v.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  v.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  p._M_ptr = (OutputStream *)0x0;
  ValidatingEncoderFactory::newEncoder((ValidatingEncoderFactory *)local_1c8,&vs);
  testEncoder((EncoderPtr *)local_1c8,td->correctCalls,&v,&p);
  boost::detail::shared_count::~shared_count(&local_1c0);
  this = (OutputStream *)&in;
  avro::memoryInputStream(this);
  local_1e8.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
  ;
  local_1e8.m_end = "";
  local_1f8.m_begin = "";
  local_1f8.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,&local_1e8,0x2e0,&local_1f8);
  ValidatingDecoderFactory::newDecoder((ValidatingDecoderFactory *)local_1c8,&vs);
  testDecoder((DecoderPtr *)local_1c8,&v,_in,td->incorrectCalls,td->depth);
  this_00 = &local_1c0;
  boost::detail::shared_count::~shared_count(this_00);
  local_208.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
  ;
  local_208.m_end = "";
  local_218.m_begin = "";
  local_218.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this_00,&local_208,0x2e0,&local_218);
  local_290.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x0;
  local_290.m_message.px = (element_type *)0x0;
  local_290.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c0.pi_._0_1_ = false;
  local_1c8 = (undefined1  [8])&PTR__lazy_ostream_001edb38;
  local_1b8 = &boost::unit_test::lazy_ostream::inst;
  local_1b0 = "exception Exception expected but not raised";
  local_228.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
  ;
  local_228.m_end = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_290,(lazy_ostream *)local_1c8,&local_228,0x2e0,CHECK,CHECK_MSG,0);
  boost::detail::shared_count::~shared_count(&local_290.m_message.pn);
  if (_in != (InputStream *)0x0) {
    (**(code **)(*(long *)_in + 8))();
  }
  if (p._M_ptr != (OutputStream *)0x0) {
    (**(code **)(*(long *)p._M_ptr + 8))();
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&v);
  boost::detail::shared_count::~shared_count(&vs.root_.pn);
  return;
}

Assistant:

void testReaderFail(const TestData2& td) {
    static int testNo = 0;
    testNo++;
    BOOST_TEST_CHECKPOINT("Test: " << testNo << ' '
        << " schema: " << td.schema
        << " correctCalls: " << td.correctCalls
        << " incorrectCalls: " << td.incorrectCalls
        << " skip-level: " << td.depth);
    ValidSchema vs = makeValidSchema(td.schema);

    vector<string> v;
    auto_ptr<OutputStream> p;
    testEncoder(CodecFactory::newEncoder(vs), td.correctCalls, v, p);
    auto_ptr<InputStream> in = memoryInputStream(*p);
    BOOST_CHECK_THROW(
        testDecoder(CodecFactory::newDecoder(vs), v, *in,
            td.incorrectCalls, td.depth), Exception);
}